

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_Variant_setScalarCopy(UA_Variant *v,void *p,UA_DataType *type)

{
  UA_StatusCode UVar1;
  void *dst;
  
  dst = malloc((ulong)type->memSize);
  if (dst == (void *)0x0) {
    UVar1 = 0x80030000;
  }
  else {
    UVar1 = UA_copy(p,dst,type);
    if (UVar1 == 0) {
      v->data = (void *)0x0;
      v->arrayDimensionsSize = 0;
      v->arrayDimensions = (UA_UInt32 *)0x0;
      *(undefined8 *)&v->storageType = 0;
      v->arrayLength = 0;
      v->type = type;
      v->data = dst;
      UVar1 = 0;
    }
    else {
      free(dst);
    }
  }
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Variant_setScalarCopy(UA_Variant *v, const void *p,
                         const UA_DataType *type) {
    void *n = UA_malloc(type->memSize);
    if(!n)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    UA_StatusCode retval = UA_copy(p, n, type);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_free(n);
        //cppcheck-suppress memleak
        return retval;
    }
    UA_Variant_setScalar(v, n, type);
    //cppcheck-suppress memleak
    return UA_STATUSCODE_GOOD;
}